

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::geometry::anon_unknown_2::GeometryExpanderRenderTest::createInstance
          (GeometryExpanderRenderTest *this,Context *context)

{
  GeometryExpanderRenderTestInstance *this_00;
  
  this_00 = (GeometryExpanderRenderTestInstance *)operator_new(0x70);
  GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
            (this_00,context,this->m_primitiveType,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__GeometryExpanderRenderTestInstance_00d1a130;
  GeometryInputTestInstance::genVertexAttribData((GeometryInputTestInstance *)this_00);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* GeometryExpanderRenderTest::createInstance (Context& context) const
{
	return new GeometryInputTestInstance(context, m_primitiveType, getName());
}